

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecMult.c
# Opt level: O1

Vec_Bit_t * Acec_MultMarkPPs(Gia_Man_t *p)

{
  uint uVar1;
  Vec_Bit_t *pVVar2;
  int *__s;
  Vec_Wrd_t *vTemp;
  word *pwVar3;
  Vec_Int_t *vSupp;
  int *piVar4;
  word wVar5;
  byte bVar6;
  uint uVar7;
  long lVar8;
  long lVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  word wVar13;
  ulong uVar14;
  long lVar15;
  ulong local_60;
  
  uVar1 = p->nObjs;
  iVar11 = (((int)uVar1 >> 5) + 1) - (uint)((uVar1 & 0x1f) == 0);
  pVVar2 = (Vec_Bit_t *)malloc(0x10);
  pVVar2->nSize = 0;
  iVar10 = iVar11 * 0x20;
  pVVar2->nCap = iVar10;
  if (iVar11 == 0) {
    __s = (int *)0x0;
  }
  else {
    __s = (int *)malloc((long)iVar11 * 4);
  }
  pVVar2->pArray = __s;
  pVVar2->nSize = iVar10;
  local_60 = 0;
  memset(__s,0,(long)iVar11 << 2);
  vTemp = (Vec_Wrd_t *)malloc(0x10);
  uVar7 = 0x10;
  if (0xe < uVar1 - 1) {
    uVar7 = uVar1;
  }
  vTemp->nSize = 0;
  vTemp->nCap = uVar7;
  if (uVar7 == 0) {
    pwVar3 = (word *)0x0;
  }
  else {
    pwVar3 = (word *)malloc((long)(int)uVar7 << 3);
  }
  vTemp->pArray = pwVar3;
  vTemp->nSize = uVar1;
  memset(pwVar3,0,(long)(int)uVar1 << 3);
  vSupp = (Vec_Int_t *)malloc(0x10);
  vSupp->nCap = 100;
  vSupp->nSize = 0;
  piVar4 = (int *)malloc(400);
  vSupp->pArray = piVar4;
  Gia_ManCleanMark0(p);
  if (0 < p->nObjs) {
    uVar14 = 0;
    local_60 = 0;
    do {
      if ((~*(uint *)(p->pObjs + uVar14) & 0x1fffffff) != 0 &&
          -1 < (int)*(uint *)(p->pObjs + uVar14)) {
        wVar5 = Gia_ObjComputeTruth6Cis(p,(int)uVar14 * 2,vSupp,vTemp);
        iVar11 = vSupp->nSize;
        if ((long)iVar11 < 7) {
          wVar13 = wVar5;
          if (iVar11 < 1) {
            iVar12 = 0;
          }
          else {
            piVar4 = vSupp->pArray;
            lVar9 = 0;
            lVar15 = 0xa0a638;
            pwVar3 = s_Truths6Neg;
            iVar12 = 0;
            do {
              bVar6 = (byte)(1 << ((byte)lVar9 & 0x1f));
              if ((*pwVar3 & (wVar13 >> (bVar6 & 0x3f) ^ wVar13)) != 0) {
                lVar8 = (long)iVar12;
                if (lVar8 < lVar9) {
                  if (piVar4 != (int *)0x0) {
                    piVar4[lVar8] = piVar4[lVar9];
                  }
                  bVar6 = (char)(-1 << ((byte)iVar12 & 0x1f)) + bVar6;
                  lVar8 = lVar8 * 0x90;
                  wVar13 = (wVar13 & *(ulong *)(lVar15 + 8 + lVar8)) >> (bVar6 & 0x3f) |
                           (*(ulong *)(lVar15 + lVar8) & wVar13) << (bVar6 & 0x3f) |
                           *(ulong *)(lVar15 + -8 + lVar8) & wVar13;
                }
                iVar12 = iVar12 + 1;
              }
              lVar9 = lVar9 + 1;
              pwVar3 = pwVar3 + 1;
              lVar15 = lVar15 + 0x18;
            } while (iVar11 != lVar9);
          }
          if ((iVar12 != iVar11) && (wVar5 = wVar13, iVar11 <= iVar12)) {
            __assert_fail("k < nVars",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilTruth.h"
                          ,0x754,"int Abc_Tt6MinBase(word *, int *, int)");
          }
          vSupp->nSize = iVar12;
          if (iVar12 < 6) {
            lVar9 = 0;
            do {
              if ((wVar5 == *(ulong *)((long)&DAT_00a0a450 + lVar9)) ||
                 ((*(ulong *)((long)&DAT_00a0a450 + lVar9) ^ wVar5) == 0xffffffffffffffff)) {
                if ((long)iVar10 <= (long)uVar14) {
                  __assert_fail("i >= 0 && i < p->nSize",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecBit.h"
                                ,0x132,"void Vec_BitWriteEntry(Vec_Bit_t *, int, int)");
                }
                __s[uVar14 >> 5 & 0x7ffffff] =
                     __s[uVar14 >> 5 & 0x7ffffff] | 1 << ((byte)uVar14 & 0x1f);
                local_60 = (ulong)((int)local_60 + 1);
                break;
              }
              lVar9 = lVar9 + 8;
            } while (lVar9 != 0x98);
          }
        }
      }
      uVar14 = uVar14 + 1;
    } while ((long)uVar14 < (long)p->nObjs);
  }
  Gia_ManCleanMark0(p);
  printf("Collected %d pps.\n",local_60);
  if (vSupp->pArray != (int *)0x0) {
    free(vSupp->pArray);
    vSupp->pArray = (int *)0x0;
  }
  free(vSupp);
  if (vTemp->pArray != (word *)0x0) {
    free(vTemp->pArray);
    vTemp->pArray = (word *)0x0;
  }
  free(vTemp);
  return pVVar2;
}

Assistant:

Vec_Bit_t * Acec_MultMarkPPs( Gia_Man_t * p )
{
    word Saved[32] = {
        ABC_CONST(0xF335ACC0F335ACC0),
        ABC_CONST(0x35C035C035C035C0),
        ABC_CONST(0xD728D728D728D728),
        ABC_CONST(0xFD80FD80FD80FD80),
        ABC_CONST(0xACC0ACC0ACC0ACC0),
        ABC_CONST(0x7878787878787878),
        ABC_CONST(0x2828282828282828),
        ABC_CONST(0xD0D0D0D0D0D0D0D0),
        ABC_CONST(0x8080808080808080),
        ABC_CONST(0x8888888888888888),
        ABC_CONST(0xAAAAAAAAAAAAAAAA),
        ABC_CONST(0x5555555555555555),

        ABC_CONST(0xD5A8D5A8D5A8D5A8),
        ABC_CONST(0x2A572A572A572A57),
        ABC_CONST(0xF3C0F3C0F3C0F3C0),
        ABC_CONST(0x5858585858585858),
        ABC_CONST(0xA7A7A7A7A7A7A7A7),
        ABC_CONST(0x2727272727272727),
        ABC_CONST(0xD8D8D8D8D8D8D8D8)
    };

    Vec_Bit_t * vRes = Vec_BitStart( Gia_ManObjNum(p) );
    Vec_Wrd_t * vTemp = Vec_WrdStart( Gia_ManObjNum(p) );
    Vec_Int_t * vSupp = Vec_IntAlloc( 100 );
    int i, iObj, nProds = 0;
    Gia_ManCleanMark0(p);
    Gia_ManForEachAndId( p, iObj )
    {
        word Truth = Gia_ObjComputeTruth6Cis( p, Abc_Var2Lit(iObj, 0), vSupp, vTemp );
        if ( Vec_IntSize(vSupp) > 6  )
            continue;
        vSupp->nSize = Abc_Tt6MinBase( &Truth, vSupp->pArray, vSupp->nSize );
        if ( Vec_IntSize(vSupp) > 5  )
            continue;
        for ( i = 0; i < 32 && Saved[i]; i++ )
        {
            if ( Truth == Saved[i] || Truth == ~Saved[i] )
            {
                Vec_BitWriteEntry( vRes, iObj, 1 );
                nProds++;
                break;
            }
        }
    }
    Gia_ManCleanMark0(p);
    printf( "Collected %d pps.\n", nProds );
    Vec_IntFree( vSupp );
    Vec_WrdFree( vTemp );
    return vRes;
}